

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O0

bool UTF_uc8_to_uc32(UTF_UC8 *uc8,UTF_UC32 *uc32)

{
  bool bVar1;
  int iVar2;
  int count;
  UTF_UC32 *uc32_local;
  UTF_UC8 *uc8_local;
  
  iVar2 = UTF_uc8_count(*uc8);
  if (iVar2 == 0) {
    uc8_local._7_1_ = false;
  }
  else {
    switch(iVar2) {
    case 1:
      *uc32 = (uint)*uc8;
      break;
    case 2:
      bVar1 = UTF_uc8_is_trail(uc8[1]);
      if (!bVar1) {
        return false;
      }
      if ((*uc8 & 0x1e) == 0) {
        return false;
      }
      *uc32 = (*uc8 & 0x1f) << 6;
      *uc32 = uc8[1] & 0x3f | *uc32;
      break;
    case 3:
      bVar1 = UTF_uc8_is_trail(uc8[1]);
      if ((!bVar1) || (bVar1 = UTF_uc8_is_trail(uc8[2]), !bVar1)) {
        return false;
      }
      if (((*uc8 & 0xf) == 0) && ((uc8[1] & 0x20) == 0)) {
        return false;
      }
      *uc32 = (*uc8 & 0xf) << 0xc;
      *uc32 = (uc8[1] & 0x3f) << 6 | *uc32;
      *uc32 = uc8[2] & 0x3f | *uc32;
      break;
    case 4:
      bVar1 = UTF_uc8_is_trail(uc8[1]);
      if (((!bVar1) || (bVar1 = UTF_uc8_is_trail(uc8[2]), !bVar1)) ||
         (bVar1 = UTF_uc8_is_trail(uc8[3]), !bVar1)) {
        return false;
      }
      if (((*uc8 & 7) == 0) && ((uc8[1] & 0x30) == 0)) {
        return false;
      }
      *uc32 = (*uc8 & 7) << 0x12;
      *uc32 = (uc8[1] & 0x3f) << 0xc | *uc32;
      *uc32 = (uc8[2] & 0x3f) << 6 | *uc32;
      *uc32 = uc8[3] & 0x3f | *uc32;
      break;
    default:
      return false;
    }
    uc8_local._7_1_ = true;
  }
  return uc8_local._7_1_;
}

Assistant:

static __inline bool
UTF_uc8_to_uc32(const UTF_UC8 uc8[4], UTF_UC32 *uc32)
{
    int count = UTF_uc8_count(uc8[0]);
    if (!count)
        return false;

    switch (count)
    {
    case 1:
        *uc32 = uc8[0];
        break;

    case 2:
        if (!UTF_uc8_is_trail(uc8[1]))
            return false;

        if ((uc8[0] & 0x1E) == 0)
            return false;

        *uc32 = (UTF_STATIC_CAST(UTF_UC32, uc8[0] & 0x1F) << 6);
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[1] & 0x3F);
        break;

    case 3:
        if (!UTF_uc8_is_trail(uc8[1]) || !UTF_uc8_is_trail(uc8[2]))
            return false;

        if ((uc8[0] & 0x0F) == 0 && (uc8[1] & 0x20) == 0)
            return false;

        *uc32 = UTF_STATIC_CAST(UTF_UC32, uc8[0] & 0x0F) << 12;
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[1] & 0x3F) << 6;
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[2] & 0x3F);
        break;

    case 4:
        if (!UTF_uc8_is_trail(uc8[1]) ||
            !UTF_uc8_is_trail(uc8[2]) ||
            !UTF_uc8_is_trail(uc8[3]))
        {
            return false;
        }

        if ((uc8[0] & 0x07) == 0 && (uc8[1] & 0x30) == 0)
            return false;

        *uc32 = UTF_STATIC_CAST(UTF_UC32, uc8[0] & 0x07) << 18;
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[1] & 0x3F) << 12;
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[2] & 0x3F) << 6;
        *uc32 |= UTF_STATIC_CAST(UTF_UC32, uc8[3] & 0x3F);
        break;

    default:
        return false;
    }

    return true;
}